

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptFunction::GetDiagValueString
          (JavascriptFunction *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int32 propertyId;
  charcount_t countNeeded;
  undefined4 extraout_var;
  ScriptContext *pSVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  uint *puVar8;
  JavascriptLibrary *this_00;
  ScriptContext *this_01;
  PropertyString *name;
  uint local_84;
  size_t local_80;
  size_t decodedCount;
  PrintOffsets *printOffsets;
  size_t cbLength;
  LPCUTF8 pbStart;
  DecodeOptions local_58;
  charcount_t count;
  DecodeOptions options;
  charcount_t displayNameLength;
  Utf8SourceInfo *sourceInfo;
  ParseableFunctionInfo *func;
  FunctionProxy *proxy;
  Var sourceString;
  JavascriptString *pString;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptFunction *this_local;
  
  sourceString = (Var)0x0;
  pString = (JavascriptString *)requestContext;
  requestContext_local = (ScriptContext *)stringBuilder;
  stringBuilder_local = (StringBuilder<Memory::ArenaAllocator> *)this;
  iVar3 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])();
  proxy = (FunctionProxy *)CONCAT44(extraout_var,iVar3);
  if (proxy == (FunctionProxy *)0x0) {
    func = (ParseableFunctionInfo *)GetFunctionProxy(this);
    if (func == (ParseableFunctionInfo *)0x0) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      sourceString = JavascriptLibrary::GetFunctionDisplayString(this_00);
    }
    else {
      sourceInfo = (Utf8SourceInfo *)FunctionProxy::EnsureDeserialized((FunctionProxy *)func);
      _options = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)sourceInfo);
      bVar2 = Utf8SourceInfo::GetIsLibraryCode(_options);
      if (!bVar2) {
        bVar2 = Utf8SourceInfo::IsCesu8(_options);
        local_58 = (DecodeOptions)bVar2;
        pbStart._4_4_ = ParseableFunctionInfo::LengthInChars((ParseableFunctionInfo *)sourceInfo);
        cbLength = (size_t)ParseableFunctionInfo::GetToStringSource
                                     ((ParseableFunctionInfo *)sourceInfo,
                                      L"JavascriptFunction::GetDiagValueString");
        uVar4 = ParseableFunctionInfo::LengthInBytes((ParseableFunctionInfo *)sourceInfo);
        printOffsets = (PrintOffsets *)(ulong)uVar4;
        decodedCount = (size_t)ParseableFunctionInfo::GetPrintOffsets
                                         ((ParseableFunctionInfo *)sourceInfo);
        if ((PrintOffsets *)decodedCount != (PrintOffsets *)0x0) {
          pbStart._4_4_ =
               ((((PrintOffsets *)decodedCount)->cbEndPrintOffset -
                ((PrintOffsets *)decodedCount)->cbStartPrintOffset) - (int)printOffsets) * 3 +
               pbStart._4_4_;
          printOffsets = (PrintOffsets *)
                         (ulong)(((PrintOffsets *)decodedCount)->cbEndPrintOffset -
                                ((PrintOffsets *)decodedCount)->cbStartPrintOffset);
        }
        pcVar6 = StringBuilder<Memory::ArenaAllocator>::AllocBufferSpace
                           ((StringBuilder<Memory::ArenaAllocator> *)requestContext_local,
                            pbStart._4_4_);
        local_80 = utf8::DecodeUnitsInto
                             (pcVar6,(LPCUTF8 *)&cbLength,
                              (LPCUTF8)((long)&printOffsets->cbStartPrintOffset + cbLength),local_58
                              ,(bool *)0x0);
        if (0x7ffffffd < local_80) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                      ,0xc61,"(decodedCount < MaxCharCount)",
                                      "decodedCount < MaxCharCount");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pSVar5 = requestContext_local;
        local_84 = (uint)local_80;
        puVar8 = min<unsigned_int>(&DIAG_MAX_FUNCTION_STRING,&local_84);
        StringBuilder<Memory::ArenaAllocator>::IncreaseCount
                  ((StringBuilder<Memory::ArenaAllocator> *)pSVar5,*puVar8);
        return 1;
      }
      count = 0;
      pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      pcVar6 = FunctionProxy::GetShortDisplayName((FunctionProxy *)sourceInfo,&count);
      sourceString = GetLibraryCodeDisplayString(pSVar5,pcVar6);
    }
  }
  else {
    bVar2 = TaggedInt::Is(proxy);
    if (bVar2) {
      pSVar5 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      propertyId = TaggedInt::ToInt32(proxy);
      name = ScriptContext::GetPropertyString(this_01,propertyId);
      sourceString = GetNativeFunctionDisplayString(pSVar5,&name->super_JavascriptString);
    }
    else {
      bVar2 = VarIs<Js::JavascriptString>(proxy);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                    ,0xc73,"(VarIs<JavascriptString>(sourceString))",
                                    "VarIs<JavascriptString>(sourceString)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      sourceString = VarTo<Js::JavascriptString>(proxy);
    }
  }
  if (sourceString == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xc78,"(pString)","pString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar5 = requestContext_local;
  pcVar6 = JavascriptString::GetString((JavascriptString *)sourceString);
  countNeeded = JavascriptString::GetLength((JavascriptString *)sourceString);
  StringBuilder<Memory::ArenaAllocator>::Append
            ((StringBuilder<Memory::ArenaAllocator> *)pSVar5,pcVar6,countNeeded);
  return 1;
}

Assistant:

BOOL JavascriptFunction::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        JavascriptString * pString = NULL;

        Var sourceString = this->GetSourceString();

        if (sourceString == nullptr)
        {
            FunctionProxy* proxy = this->GetFunctionProxy();
            if (proxy)
            {
                ParseableFunctionInfo * func = proxy->EnsureDeserialized();
                Utf8SourceInfo* sourceInfo = func->GetUtf8SourceInfo();
                if (sourceInfo->GetIsLibraryCode())
                {
                    charcount_t displayNameLength = 0;
                    pString = JavascriptFunction::GetLibraryCodeDisplayString(this->GetScriptContext(), func->GetShortDisplayName(&displayNameLength));
                }
                else
                {
                    utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
                    charcount_t count = func->LengthInChars();
                    LPCUTF8 pbStart = func->GetToStringSource(_u("JavascriptFunction::GetDiagValueString"));
                    size_t cbLength = func->LengthInBytes();
                    PrintOffsets* printOffsets = func->GetPrintOffsets();
                    if (printOffsets != nullptr)
                    {
                        count += 3*(charcount_t)((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength);
                        cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
                    }

                    size_t decodedCount = utf8::DecodeUnitsInto(stringBuilder->AllocBufferSpace(count), pbStart, pbStart + cbLength, options);
                    Assert(decodedCount < MaxCharCount);
                    stringBuilder->IncreaseCount(min(DIAG_MAX_FUNCTION_STRING, (charcount_t)decodedCount));
                    return TRUE;
                }
            }
            else
            {
                pString = GetLibrary()->GetFunctionDisplayString();
            }
        }
        else
        {
            if (TaggedInt::Is(sourceString))
            {
                pString = GetNativeFunctionDisplayString(this->GetScriptContext(), this->GetScriptContext()->GetPropertyString(TaggedInt::ToInt32(sourceString)));
            }
            else
            {
                Assert(VarIs<JavascriptString>(sourceString));
                pString = VarTo<JavascriptString>(sourceString);
            }
        }

        Assert(pString);
        stringBuilder->Append(pString->GetString(), pString->GetLength());

        return TRUE;
    }